

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O3

set<Addr,_std::less<Addr>,_std::allocator<Addr>_> * __thiscall
BpTree<int>::FindLess
          (set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *__return_storage_ptr__,
          BpTree<int> *this,int k,bool EQ)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  char cVar3;
  pointer pcVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  size_t __n;
  long lVar9;
  ulong uVar10;
  IndexNode<int> C;
  IndexNode<int> local_f0;
  char local_90;
  vector<int,_std::allocator<int>_> local_88;
  _Vector_base<char,_std::allocator<char>_> local_70;
  vector<Addr,_std::allocator<Addr>_> local_58;
  Addr local_40;
  Addr AStack_38;
  
  IndexNode<int>::IndexNode(&local_f0,this->N);
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  if ((this->RootAddr).FileOff == -1) {
LAB_00129e89:
    if (local_f0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
        _M_start != (Addr *)0x0) {
      operator_delete(local_f0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_f0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_f0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_f0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (char *)0x0) {
      operator_delete(local_f0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_f0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_f0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_f0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_f0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_f0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_f0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    return __return_storage_ptr__;
  }
  FindNode(this,this->RootAddr,&local_f0);
  while( true ) {
    local_90 = local_f0.NodeState;
    std::vector<int,_std::allocator<int>_>::vector(&local_88,&local_f0.k);
    local_70._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_70._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_70._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::_Vector_base<char,_std::allocator<char>_>::_M_create_storage
              (&local_70,
               (long)local_f0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_f0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start);
    pcVar4 = local_70._M_impl.super__Vector_impl_data._M_start;
    __n = (long)local_f0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_f0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start;
    if (__n != 0) {
      memmove(local_70._M_impl.super__Vector_impl_data._M_start,
              local_f0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start,__n);
    }
    local_70._M_impl.super__Vector_impl_data._M_finish = pcVar4 + __n;
    std::vector<Addr,_std::allocator<Addr>_>::vector(&local_58,&local_f0.p);
    cVar3 = local_90;
    local_40 = local_f0.parent;
    AStack_38 = local_f0.self;
    if (local_58.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_58.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_58.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_58.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_70._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_70._M_impl.super__Vector_impl_data._M_start,
                      (long)local_70._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_70._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (cVar3 == '1') break;
    FindNode(this,*local_f0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                   super__Vector_impl_data._M_start,&local_f0);
  }
LAB_00129d3a:
  uVar5 = this->N;
  uVar6 = (ulong)uVar5;
  uVar8 = 0;
  if (EQ) {
    if ((1 < (int)uVar5) &&
       (*local_f0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_start == '1')) {
      lVar9 = 0;
      uVar10 = 0;
      do {
        uVar5 = (uint)uVar6;
        uVar8 = uVar10;
        if (k < local_f0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar10]) break;
        std::_Rb_tree<Addr,Addr,std::_Identity<Addr>,std::less<Addr>,std::allocator<Addr>>::
        _M_insert_unique<Addr_const&>
                  ((_Rb_tree<Addr,Addr,std::_Identity<Addr>,std::less<Addr>,std::allocator<Addr>> *)
                   __return_storage_ptr__,
                   (Addr *)((long)&(local_f0.p.super__Vector_base<Addr,_std::allocator<Addr>_>.
                                    _M_impl.super__Vector_impl_data._M_start)->BlockNum + lVar9));
        uVar8 = uVar10 + 1;
        uVar5 = this->N;
        uVar6 = (ulong)(int)uVar5;
        if ((long)(uVar6 - 1) <= (long)uVar8) break;
        lVar9 = lVar9 + 8;
        lVar2 = uVar10 + 1;
        uVar10 = uVar10 + 1;
      } while (local_f0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start[lVar2] == '1');
    }
    uVar7 = (uint)uVar8;
    if (k < local_f0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start[uVar8 & 0xffffffff]) goto LAB_00129e89;
  }
  else {
    if ((1 < (int)uVar5) &&
       (*local_f0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_start == '1')) {
      lVar9 = 0;
      uVar10 = 0;
      do {
        uVar5 = (uint)uVar6;
        uVar8 = uVar10;
        if (k <= local_f0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar10]) break;
        std::_Rb_tree<Addr,Addr,std::_Identity<Addr>,std::less<Addr>,std::allocator<Addr>>::
        _M_insert_unique<Addr_const&>
                  ((_Rb_tree<Addr,Addr,std::_Identity<Addr>,std::less<Addr>,std::allocator<Addr>> *)
                   __return_storage_ptr__,
                   (Addr *)((long)&(local_f0.p.super__Vector_base<Addr,_std::allocator<Addr>_>.
                                    _M_impl.super__Vector_impl_data._M_start)->BlockNum + lVar9));
        uVar8 = uVar10 + 1;
        uVar5 = this->N;
        uVar6 = (ulong)(int)uVar5;
        if ((long)(uVar6 - 1) <= (long)uVar8) break;
        lVar9 = lVar9 + 8;
        lVar2 = uVar10 + 1;
        uVar10 = uVar10 + 1;
      } while (local_f0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start[lVar2] == '1');
    }
    uVar7 = (uint)uVar8;
    if (k <= local_f0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[uVar8 & 0xffffffff]) goto LAB_00129e89;
  }
  uVar5 = uVar5 - 1;
  if (uVar7 != uVar5) goto LAB_00129e4e;
  if (local_f0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
      _M_start[(int)uVar7].FileOff != -1) goto LAB_00129e73;
  goto LAB_00129e89;
LAB_00129e4e:
  if (local_f0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar7] == '0') {
    if (local_f0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
        _M_start[(int)uVar5].FileOff == -1) goto LAB_00129e89;
LAB_00129e73:
    FindNode(this,local_f0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                  super__Vector_impl_data._M_start[(int)uVar5],&local_f0);
  }
  goto LAB_00129d3a;
}

Assistant:

set<Addr> BpTree<K>::FindLess(K k, bool EQ) {
	IndexNode<K> C(N);
	set<Addr> ret;
	int i, pos = 0;
	if (this->RootAddr.FileOff == -1)
		return ret;
	this->FindNode(this->RootAddr, C);
	while (!this->IsLeaf(C)) {
		this->FindNode(C.p[0], C);
	}
	while (1) {
		if (EQ == false) {
			for (i = pos; i < N - 1 && C.v[i] == '1' && C.k[i] < k; i++) {
				ret.insert(C.p[i]);
			}
			if (C.k[i] >= k) {
				break;
			}
		}
		else {
			for (i = pos; i < N - 1 && C.v[i] == '1' && C.k[i] <= k; i++) {
				ret.insert(C.p[i]);
			}
			if (C.k[i] > k) {
				break;
			}
		}
		if ((i == N - 1 || C.v[i] == '0') && C.p[N - 1].FileOff == -1) {
			break;
		}
		else if (i == N - 1 || C.v[i] == '0') {
			pos = 0;
			this->FindNode(C.p[N - 1], C);
		}
	}
	return ret;
}